

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O0

CURLcode Curl_cw_pause_flush(Curl_easy *data)

{
  Curl_cwriter *cw_pause_00;
  CURLcode local_1c;
  CURLcode result;
  Curl_cwriter *cw_pause;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  cw_pause_00 = Curl_cwriter_get_by_type(data,&Curl_cwt_pause);
  if (cw_pause_00 != (Curl_cwriter *)0x0) {
    local_1c = cw_pause_flush(data,cw_pause_00);
  }
  return local_1c;
}

Assistant:

CURLcode Curl_cw_pause_flush(struct Curl_easy *data)
{
  struct Curl_cwriter *cw_pause;
  CURLcode result = CURLE_OK;

  cw_pause = Curl_cwriter_get_by_type(data, &Curl_cwt_pause);
  if(cw_pause)
    result = cw_pause_flush(data, cw_pause);

  return result;
}